

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O3

void __thiscall
embree::SceneGraph::PlyParser::loadPropertyData
          (PlyParser *this,vector<float,_std::allocator<float>_> *vec,Tag ty)

{
  pointer *ppfVar1;
  iterator __position;
  char cVar2;
  byte bVar3;
  short sVar4;
  unsigned_short uVar5;
  uint uVar6;
  runtime_error *this_00;
  float fVar7;
  double dVar8;
  float local_14;
  
  switch(ty) {
  case PTY_CHAR:
    cVar2 = read_char(this);
    uVar6 = (uint)cVar2;
    break;
  case PTY_UCHAR:
    bVar3 = read_uchar(this);
    uVar6 = (uint)bVar3;
    break;
  case PTY_SHORT:
    sVar4 = read_short(this);
    uVar6 = (uint)sVar4;
    break;
  case PTY_USHORT:
    uVar5 = read_ushort(this);
    uVar6 = (uint)uVar5;
    break;
  case PTY_INT:
    uVar6 = read_int(this);
    break;
  case PTY_UINT:
    uVar6 = read_uint(this);
    fVar7 = (float)uVar6;
    goto LAB_001a3462;
  case PTY_FLOAT:
    fVar7 = read_float(this);
    goto LAB_001a3462;
  case PTY_DOUBLE:
    dVar8 = read_double(this);
    fVar7 = (float)dVar8;
    goto LAB_001a3462;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fVar7 = (float)(int)uVar6;
LAB_001a3462:
  __position._M_current =
       (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(vec,__position,&local_14);
  }
  else {
    *__position._M_current = fVar7;
    ppfVar1 = &(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppfVar1 = *ppfVar1 + 1;
  }
  return;
}

Assistant:

void loadPropertyData(std::vector<float>& vec, Type::Tag ty) 
      {
        switch (ty) {
        case Type::PTY_CHAR   : vec.push_back(float(read_char()));   break;
        case Type::PTY_UCHAR  : vec.push_back(float(read_uchar()));  break;
        case Type::PTY_SHORT  : vec.push_back(float(read_short()));  break;
        case Type::PTY_USHORT : vec.push_back(float(read_ushort())); break;
        case Type::PTY_INT    : vec.push_back(float(read_int()));    break;
        case Type::PTY_UINT   : vec.push_back(float(read_uint()));   break;
        case Type::PTY_FLOAT  : vec.push_back(float(read_float()));  break;
        case Type::PTY_DOUBLE : vec.push_back(float(read_double())); break;
        default : throw std::runtime_error("invalid type");
        }
      }